

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  ostream *poVar1;
  pthread_mutex_t *in_RDI;
  int in_stack_0000002c;
  char *in_stack_00000030;
  int gtest_error;
  GTestLog local_10;
  int local_c;
  
  local_c = pthread_mutex_init(in_RDI,(pthread_mutexattr_t *)0x0);
  if (local_c != 0) {
    GTestLog::GTestLog((GTestLog *)this,gtest_error,in_stack_00000030,in_stack_0000002c);
    poVar1 = GTestLog::GetStream(&local_10);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_init(&mutex_, NULL)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_c);
    GTestLog::~GTestLog((GTestLog *)poVar1);
  }
  in_RDI[1].__size[0] = '\0';
  return;
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, NULL));
    has_owner_ = false;
  }